

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.c
# Opt level: O2

void store_message(wchar_t turn,char *msg)

{
  message *pmVar1;
  char *pcVar2;
  wchar_t wVar3;
  
  pmVar1 = msghistory;
  if (*msg != '\0') {
    wVar3 = L'\0';
    if (histpos + L'\x01' < histsize) {
      wVar3 = histpos + L'\x01';
    }
    histpos = wVar3;
    msghistory[wVar3].turn = turn;
    free(pmVar1[wVar3].msg);
    pcVar2 = strdup(msg);
    pmVar1[wVar3].msg = pcVar2;
  }
  return;
}

Assistant:

static void store_message(int turn, const char *msg)
{
    if (!*msg)
	return;
    
    histpos++;
    if (histpos >= histsize)
	histpos = 0;
    
    msghistory[histpos].turn = turn;
    if (msghistory[histpos].msg)
	free(msghistory[histpos].msg);
    msghistory[histpos].msg = strdup(msg);
}